

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O0

difference_iterator<std::_Fwd_list_const_iterator<int>,_std::_Fwd_list_const_iterator<int>,_std::less<void>_>
* __thiscall
burst::
make_difference_iterator<boost::iterator_range<std::_Fwd_list_const_iterator<int>>,boost::iterator_range<std::_Fwd_list_const_iterator<int>>,void>
          (difference_iterator<std::_Fwd_list_const_iterator<int>,_std::_Fwd_list_const_iterator<int>,_std::less<void>_>
           *__return_storage_ptr__,burst *this,
          iterator_range<std::_Fwd_list_const_iterator<int>_> *minuend,
          iterator_range<std::_Fwd_list_const_iterator<int>_> *subtrahend)

{
  _Fwd_list_const_iterator<int> this_00;
  _Fwd_list_const_iterator<int> minuend_begin;
  _Fwd_list_const_iterator<int> minuend_end;
  _Fwd_list_const_iterator<int> subtrahend_begin;
  _Fwd_list_const_iterator<int> in_R9;
  iterator_range<std::_Fwd_list_const_iterator<int>_> *subtrahend_local;
  iterator_range<std::_Fwd_list_const_iterator<int>_> *minuend_local;
  
  this_00 = std::begin<boost::iterator_range<std::_Fwd_list_const_iterator<int>>>
                      ((iterator_range<std::_Fwd_list_const_iterator<int>_> *)this);
  minuend_begin =
       std::end<boost::iterator_range<std::_Fwd_list_const_iterator<int>>>
                 ((iterator_range<std::_Fwd_list_const_iterator<int>_> *)this);
  minuend_end = std::begin<boost::iterator_range<std::_Fwd_list_const_iterator<int>>>(minuend);
  subtrahend_begin = std::end<boost::iterator_range<std::_Fwd_list_const_iterator<int>>>(minuend);
  make_difference_iterator<std::_Fwd_list_const_iterator<int>,std::_Fwd_list_const_iterator<int>>
            (__return_storage_ptr__,(burst *)this_00._M_node,minuend_begin,minuend_end,
             subtrahend_begin,in_R9);
  return __return_storage_ptr__;
}

Assistant:

auto make_difference_iterator (ForwardRange1 && minuend, ForwardRange2 && subtrahend)
    {
        using std::begin;
        using std::end;
        return
            make_difference_iterator
            (
                begin(std::forward<ForwardRange1>(minuend)),
                end(std::forward<ForwardRange1>(minuend)),
                begin(std::forward<ForwardRange2>(subtrahend)),
                end(std::forward<ForwardRange2>(subtrahend))
            );
    }